

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O0

GLuint SDL_GL_LoadTexture(SDL_Surface *surface,GLfloat *texcoord)

{
  undefined1 uVar1;
  GLfloat GVar2;
  int iVar3;
  int iVar4;
  undefined2 local_40;
  undefined2 uStack_3e;
  Uint8 saved_alpha;
  Uint32 saved_flags;
  SDL_Rect area;
  SDL_Surface *image;
  int h;
  int w;
  GLuint texture;
  GLfloat *texcoord_local;
  SDL_Surface *surface_local;
  
  _w = texcoord;
  texcoord_local = (GLfloat *)surface;
  iVar3 = power_of_two(surface->w);
  iVar4 = power_of_two((int)texcoord_local[5]);
  *_w = 0.0;
  _w[1] = 0.0;
  _w[2] = (float)(int)texcoord_local[4] / (float)iVar3;
  _w[3] = (float)(int)texcoord_local[5] / (float)iVar4;
  area = (SDL_Rect)SDL_CreateRGBSurface(0,iVar3,iVar4,0x20,0xff,0xff00,0xff0000,0xff000000);
  if (area == (SDL_Rect)0x0) {
    surface_local._4_4_ = 0;
  }
  else {
    GVar2 = *texcoord_local;
    uVar1 = *(undefined1 *)(*(long *)(texcoord_local + 2) + 0x28);
    if (((uint)GVar2 & 0x10000) == 0x10000) {
      SDL_SetAlpha(texcoord_local,0);
    }
    local_40 = 0;
    uStack_3e = 0;
    saved_flags._0_2_ = SUB42(texcoord_local[4],0);
    saved_flags._2_2_ = SUB42(texcoord_local[5],0);
    SDL_UpperBlit(texcoord_local,&local_40,area);
    if (((uint)GVar2 & 0x10000) == 0x10000) {
      SDL_SetAlpha(texcoord_local,(uint)GVar2 & 0x12000,uVar1);
    }
    glGenTextures(1,&h);
    glBindTexture(0xde1,h);
    glTexParameteri(0xde1,0x2800,0x2600);
    glTexParameteri(0xde1,0x2801,0x2600);
    glTexImage2D(0xde1,0,0x1908,iVar3,iVar4,0,0x1908,0x1401,*(undefined8 *)((long)area + 0x20));
    SDL_FreeSurface(area);
    surface_local._4_4_ = h;
  }
  return surface_local._4_4_;
}

Assistant:

GLuint SDL_GL_LoadTexture(SDL_Surface *surface, GLfloat *texcoord)
{
	GLuint texture;
	int w, h;
	SDL_Surface *image;
	SDL_Rect area;
	Uint32 saved_flags;
	Uint8  saved_alpha;

	/* Use the surface width and height expanded to powers of 2 */
	w = power_of_two(surface->w);
	h = power_of_two(surface->h);
	texcoord[0] = 0.0f;			/* Min X */
	texcoord[1] = 0.0f;			/* Min Y */
	texcoord[2] = (GLfloat)surface->w / w;	/* Max X */
	texcoord[3] = (GLfloat)surface->h / h;	/* Max Y */

	image = SDL_CreateRGBSurface(
			SDL_SWSURFACE,
			w, h,
			32,
#if SDL_BYTEORDER == SDL_LIL_ENDIAN /* OpenGL RGBA masks */
			0x000000FF, 
			0x0000FF00, 
			0x00FF0000, 
			0xFF000000
#else
			0xFF000000,
			0x00FF0000, 
			0x0000FF00, 
			0x000000FF
#endif
		       );
	if ( image == NULL ) {
		return 0;
	}

	/* Save the alpha blending attributes */
	saved_flags = surface->flags&(SDL_SRCALPHA|SDL_RLEACCELOK);
	saved_alpha = surface->format->alpha;
	if ( (saved_flags & SDL_SRCALPHA) == SDL_SRCALPHA ) {
		SDL_SetAlpha(surface, 0, 0);
	}

	/* Copy the surface into the GL texture image */
	area.x = 0;
	area.y = 0;
	area.w = surface->w;
	area.h = surface->h;
	SDL_BlitSurface(surface, &area, image, &area);

	/* Restore the alpha blending attributes */
	if ( (saved_flags & SDL_SRCALPHA) == SDL_SRCALPHA ) {
		SDL_SetAlpha(surface, saved_flags, saved_alpha);
	}

	/* Create an OpenGL texture for the image */
	glGenTextures(1, &texture);
	glBindTexture(GL_TEXTURE_2D, texture);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexImage2D(GL_TEXTURE_2D,
		     0,
		     GL_RGBA,
		     w, h,
		     0,
		     GL_RGBA,
		     GL_UNSIGNED_BYTE,
		     image->pixels);
	SDL_FreeSurface(image); /* No longer needed */

	return texture;
}